

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

int nn_dist_send(nn_dist *self,nn_msg *msg,nn_pipe *exclude)

{
  FILE *__stream;
  uint uVar1;
  nn_dist_data *pnVar2;
  char *pcVar3;
  nn_dist_data *local_b0;
  undefined1 local_a0 [8];
  nn_msg copy;
  nn_dist_data *data;
  nn_list_item *it;
  int rc;
  nn_pipe *exclude_local;
  nn_msg *msg_local;
  nn_dist *self_local;
  
  if (self->count == 0) {
    nn_msg_term(msg);
  }
  else {
    nn_msg_bulkcopy_start(msg,self->count);
    data = (nn_dist_data *)nn_list_begin(&self->pipes);
    while (pnVar2 = (nn_dist_data *)nn_list_end(&self->pipes), data != pnVar2) {
      if (data == (nn_dist_data *)0x0) {
        local_b0 = (nn_dist_data *)0x0;
      }
      else {
        local_b0 = data;
      }
      copy.body.u._24_8_ = local_b0;
      nn_msg_bulkcopy_cp((nn_msg *)local_a0,msg);
      if (*(nn_pipe **)(copy.body.u._24_8_ + 0x10) == exclude) {
        nn_msg_term((nn_msg *)local_a0);
LAB_001219c4:
        data = (nn_dist_data *)nn_list_next(&self->pipes,&data->item);
      }
      else {
        uVar1 = nn_pipe_send(*(nn_pipe **)(copy.body.u._24_8_ + 0x10),(nn_msg *)local_a0);
        __stream = _stderr;
        if ((int)uVar1 < 0) {
          pcVar3 = nn_err_strerror(-uVar1);
          fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)-uVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/utils/dist.c"
                  ,0x5f);
          fflush(_stderr);
          nn_err_abort();
        }
        if ((uVar1 & 1) == 0) goto LAB_001219c4;
        self->count = self->count - 1;
        data = (nn_dist_data *)nn_list_erase(&self->pipes,&data->item);
      }
    }
    nn_msg_term(msg);
  }
  return 0;
}

Assistant:

int nn_dist_send (struct nn_dist *self, struct nn_msg *msg,
    struct nn_pipe *exclude)
{
    int rc;
    struct nn_list_item *it;
    struct nn_dist_data *data;
    struct nn_msg copy;

    /*  TODO: We can optimise for the case when there's only one outbound
        pipe here. No message copying is needed in such case. */

    /*  In the specific case when there are no outbound pipes. There's nowhere
        to send the message to. Deallocate it. */
    if (nn_slow (self->count) == 0) {
        nn_msg_term (msg);
        return 0;
    }

    /*  Send the message to all the subscribers. */
    nn_msg_bulkcopy_start (msg, self->count);
    it = nn_list_begin (&self->pipes);
    while (it != nn_list_end (&self->pipes)) {
       data = nn_cont (it, struct nn_dist_data, item);
       nn_msg_bulkcopy_cp (&copy, msg);
       if (nn_fast (data->pipe == exclude)) {
           nn_msg_term (&copy);
       }
       else {
           rc = nn_pipe_send (data->pipe, &copy);
           errnum_assert (rc >= 0, -rc);
           if (rc & NN_PIPE_RELEASE) {
               --self->count;
               it = nn_list_erase (&self->pipes, it);
               continue;
           }
       }
       it = nn_list_next (&self->pipes, it);
    }
    nn_msg_term (msg);

    return 0;
}